

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

bool __thiscall glslang::TType::sameCoopMatBaseType(TType *this,TType *right)

{
  int iVar1;
  int iVar2;
  
  if ((*(uint *)&this->field_0x8 >> 0x15 & 1) == 0) {
    if (((*(uint *)&this->field_0x8 >> 0x16 & 1) == 0) || ((right->field_0xa & 0x40) == 0)) {
      return false;
    }
    iVar1 = (*this->_vptr_TType[7])(this);
    if ((iVar1 == 1) || (iVar1 = (*this->_vptr_TType[7])(this), iVar1 == 3)) {
      iVar1 = (*right->_vptr_TType[7])(right);
      if (iVar1 == 1) {
        return true;
      }
      iVar1 = (*right->_vptr_TType[7])(right);
      iVar2 = 0x15;
      if (iVar1 == 3) {
        return true;
      }
    }
    else {
      iVar1 = (*this->_vptr_TType[7])(this);
      if (((iVar1 == 9) || (iVar1 = (*this->_vptr_TType[7])(this), iVar1 == 5)) ||
         (iVar1 = (*this->_vptr_TType[7])(this), iVar1 == 7)) {
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 9) {
          return true;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 5) {
          return true;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        iVar2 = 0x15;
        if (iVar1 == 7) {
          return true;
        }
      }
      else {
        iVar1 = (*this->_vptr_TType[7])(this);
        if (((iVar1 != 8) && (iVar1 = (*this->_vptr_TType[7])(this), iVar1 != 4)) &&
           (iVar1 = (*this->_vptr_TType[7])(this), iVar1 != 6)) {
          return false;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 8) {
          return true;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 4) {
          return true;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        iVar2 = 0x15;
        if (iVar1 == 6) {
          return true;
        }
      }
    }
  }
  else {
    iVar1 = (*this->_vptr_TType[7])(this);
    if ((iVar1 == 1) || (iVar1 = (*this->_vptr_TType[7])(this), iVar1 == 3)) {
      iVar1 = (*right->_vptr_TType[7])(right);
      iVar2 = 3;
      if (iVar1 == 1) {
        return true;
      }
    }
    else {
      iVar1 = (*this->_vptr_TType[7])(this);
      if (((iVar1 == 9) || (iVar1 = (*this->_vptr_TType[7])(this), iVar1 == 5)) ||
         (iVar1 = (*this->_vptr_TType[7])(this), iVar1 == 7)) {
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 9) {
          return true;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        iVar2 = 7;
        if (iVar1 == 5) {
          return true;
        }
      }
      else {
        iVar1 = (*this->_vptr_TType[7])(this);
        if (((iVar1 != 8) && (iVar1 = (*this->_vptr_TType[7])(this), iVar1 != 4)) &&
           (iVar1 = (*this->_vptr_TType[7])(this), iVar1 != 6)) {
          return false;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        if (iVar1 == 8) {
          return true;
        }
        iVar1 = (*right->_vptr_TType[7])(right);
        iVar2 = 6;
        if (iVar1 == 4) {
          return true;
        }
      }
    }
  }
  iVar1 = (*right->_vptr_TType[7])(right);
  return iVar1 == iVar2;
}

Assistant:

bool sameCoopMatBaseType(const TType &right) const {
        bool rv = false;

        if (isCoopMatNV()) {
            rv = isCoopMatNV() && right.isCoopMatNV();
            if (getBasicType() == EbtFloat || getBasicType() == EbtFloat16)
                rv = right.getBasicType() == EbtFloat || right.getBasicType() == EbtFloat16;
            else if (getBasicType() == EbtUint || getBasicType() == EbtUint8 || getBasicType() == EbtUint16)
                rv = right.getBasicType() == EbtUint || right.getBasicType() == EbtUint8 || right.getBasicType() == EbtUint16;
            else if (getBasicType() == EbtInt || getBasicType() == EbtInt8 || getBasicType() == EbtInt16)
                rv = right.getBasicType() == EbtInt || right.getBasicType() == EbtInt8 || right.getBasicType() == EbtInt16;
            else
                rv = false;
        } else if (isCoopMatKHR() && right.isCoopMatKHR()) {
            if (getBasicType() == EbtFloat || getBasicType() == EbtFloat16)
                rv = right.getBasicType() == EbtFloat || right.getBasicType() == EbtFloat16 || right.getBasicType() == EbtCoopmat;
            else if (getBasicType() == EbtUint || getBasicType() == EbtUint8 || getBasicType() == EbtUint16)
                rv = right.getBasicType() == EbtUint || right.getBasicType() == EbtUint8 || right.getBasicType() == EbtUint16 || right.getBasicType() == EbtCoopmat;
            else if (getBasicType() == EbtInt || getBasicType() == EbtInt8 || getBasicType() == EbtInt16)
                rv = right.getBasicType() == EbtInt || right.getBasicType() == EbtInt8 || right.getBasicType() == EbtInt16 || right.getBasicType() == EbtCoopmat;
            else
                rv = false;
        }
        return rv;
    }